

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O3

void RigidBodyDynamics::ForwardDynamicsApplyConstraintForces
               (Model *model,VectorNd *Tau,ConstraintSet *CS,VectorNd *QDDot)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  uint uVar18;
  uint uVar19;
  pointer pSVar20;
  pointer pJVar21;
  pointer pSVar22;
  pointer pMVar23;
  pointer pMVar24;
  pointer pVVar25;
  pointer pSVar26;
  pointer pSVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  ulong uVar73;
  long lVar74;
  long lVar75;
  uint uVar76;
  pointer pSVar77;
  SpatialTransform *pSVar78;
  ulong uVar79;
  byte bVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  SpatialTransform X_lambda;
  SpatialVector pa;
  SpatialMatrix Ia;
  Vector3d qdd_temp;
  double dStack_5a0;
  ulong local_588;
  double dStack_570;
  SpatialMatrix local_558;
  double local_418;
  double dStack_410;
  double local_408;
  double dStack_400;
  double local_3f8;
  double dStack_3f0;
  double local_3e8;
  double dStack_3e0;
  double local_3d8;
  double dStack_3d0;
  SpatialVector_t local_3c8;
  SpatialMatrix_t local_398;
  SpatialMatrix local_278;
  SpatialMatrix local_158;
  
  bVar80 = 0;
  uVar73 = ((long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
  if (1 < uVar73) {
    uVar79 = 1;
    uVar76 = 2;
    do {
      Math::SpatialRigidBodyInertia::toMatrix
                ((model->I).
                 super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar79);
      memcpy((model->IA).super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
             super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>._M_impl
             .super__Vector_impl_data._M_start + uVar79,&local_558,0x120);
      pSVar20 = (model->v).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar75 = uVar79 * 0x30;
      Math::SpatialRigidBodyInertia::operator*
                ((model->I).
                 super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar79,pSVar20 + uVar79);
      dVar5 = *(double *)
               ((long)&pSVar20[uVar79].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
      dVar6 = *(double *)
               &pSVar20[uVar79].super_Matrix<double,_6,_1,_0,_6,_1>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
      dVar7 = *(double *)
               ((long)&pSVar20[uVar79].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
      dVar8 = *(double *)
               ((long)&pSVar20[uVar79].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28);
      dVar9 = *(double *)
               ((long)&pSVar20[uVar79].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
      dVar10 = *(double *)
                ((long)&pSVar20[uVar79].super_Matrix<double,_6,_1,_0,_6,_1>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
      pSVar20 = (model->pA).
                super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      *(double *)
       &pSVar20[uVar79].super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
           local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] *
           dVar9 + -dVar8 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array[4] +
                   -dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array[1] +
                   dVar7 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                           m_data.array[2];
      *(double *)
       ((long)&pSVar20[uVar79].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
           local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] *
           -dVar10 + dVar8 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array[3] +
                     dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array[0] +
                     -dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[2];
      pdVar1 = (double *)
               ((long)&pSVar20[uVar79].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
      *pdVar1 = local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [4] * dVar10 +
                ((local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[1] * dVar6 -
                 dVar7 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                         m_data.array[0]) -
                dVar9 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[3]);
      pdVar1[1] = local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[4] * -dVar5 +
                  dVar7 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[5];
      pdVar1 = (double *)
               ((long)&pSVar20[uVar79].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
      *pdVar1 = local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [3] * dVar5 +
                -dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                         m_data.array[5];
      pdVar1[1] = local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[3] * -dVar7 +
                  dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[4];
      dVar5 = *(double *)(*(long *)(CS + 0x238) + lVar75);
      if ((dVar5 != Math::SpatialVectorZero) || (NAN(dVar5) || NAN(Math::SpatialVectorZero))) {
LAB_00112034:
        Math::SpatialTransform::toMatrixAdjoint
                  (&local_558,
                   (model->X_base).
                   super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar79);
        lVar74 = *(long *)(CS + 0x238);
        pSVar20 = (model->pA).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        dVar6 = *(double *)(lVar74 + lVar75);
        dVar7 = *(double *)(lVar74 + 8 + lVar75);
        dVar8 = *(double *)(lVar74 + 0x10 + lVar75);
        dVar9 = *(double *)(lVar74 + 0x18 + lVar75);
        pdVar1 = (double *)(lVar74 + 0x20 + lVar75);
        dVar10 = *pdVar1;
        dVar17 = pdVar1[1];
        dVar5 = *(double *)
                 ((long)&pSVar20[uVar79].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) -
                (local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [0x1f] * dVar17 +
                local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [0x19] * dVar10 +
                local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [0x13] * dVar9 +
                local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [0xd] * dVar8 +
                local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [7] * dVar7 +
                local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [1] * dVar6);
        auVar28._8_4_ = SUB84(dVar5,0);
        auVar28._0_8_ =
             *(double *)
              &pSVar20[uVar79].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> -
             (local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
              [0x1e] * dVar17 +
             local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             [0x18] * dVar10 +
             local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             [0x12] * dVar9 +
             local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
             [0xc] * dVar8 +
             local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6]
             * dVar7 + local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0] * dVar6);
        auVar28._12_4_ = (int)((ulong)dVar5 >> 0x20);
        *(undefined1 (*) [16])
         &pSVar20[uVar79].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = auVar28;
        pdVar1 = (double *)
                 ((long)&pSVar20[uVar79].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar5 = pdVar1[1] -
                (local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                 [0x21] * dVar17 +
                local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [0x1b] * dVar10 +
                local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [0x15] * dVar9 +
                local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [0xf] * dVar8 +
                local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [9] * dVar7 +
                local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
                [3] * dVar6);
        pdVar2 = (double *)
                 ((long)&pSVar20[uVar79].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar39 = *pdVar2;
        dVar40 = pdVar2[1];
        auVar29._8_4_ = SUB84(dVar5,0);
        auVar29._0_8_ =
             *pdVar1 - (local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0x20] * dVar17 +
                       local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0x1a] * dVar10 +
                       local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0x14] * dVar9 +
                       local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0xe] * dVar8 +
                       local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[8] * dVar7 +
                       local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[2] * dVar6);
        auVar29._12_4_ = (int)((ulong)dVar5 >> 0x20);
        *(undefined1 (*) [16])
         ((long)&pSVar20[uVar79].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = auVar29;
        pdVar1 = (double *)
                 ((long)&pSVar20[uVar79].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        *pdVar1 = dVar39 - (dVar17 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                     m_storage.m_data.array[0x22] +
                           dVar10 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                    m_storage.m_data.array[0x1c] +
                           dVar9 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[0x16] +
                           dVar8 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[0x10] +
                           dVar7 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[10] +
                           dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                   m_storage.m_data.array[4]);
        pdVar1[1] = dVar40 - (dVar17 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                       m_storage.m_data.array[0x23] +
                             dVar10 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                      m_storage.m_data.array[0x1d] +
                             dVar9 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                     m_storage.m_data.array[0x17] +
                             dVar8 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                     m_storage.m_data.array[0x11] +
                             dVar7 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                     m_storage.m_data.array[0xb] +
                             dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                     m_storage.m_data.array[5]);
      }
      else {
        lVar74 = *(long *)(CS + 0x238) + lVar75;
        if ((((*(double *)(lVar74 + 8) != DAT_0014f5b8) ||
             ((((NAN(*(double *)(lVar74 + 8)) || NAN(DAT_0014f5b8) ||
                (*(double *)(lVar74 + 0x10) != DAT_0014f5c0)) ||
               (NAN(*(double *)(lVar74 + 0x10)) || NAN(DAT_0014f5c0))) ||
              ((*(double *)(lVar74 + 0x18) != DAT_0014f5c8 ||
               (NAN(*(double *)(lVar74 + 0x18)) || NAN(DAT_0014f5c8))))))) ||
            (*(double *)(lVar74 + 0x20) != DAT_0014f5d0)) ||
           (NAN(*(double *)(lVar74 + 0x20)) || NAN(DAT_0014f5d0))) goto LAB_00112034;
        if ((*(double *)(lVar74 + 0x28) != DAT_0014f5d8) ||
           (NAN(*(double *)(lVar74 + 0x28)) || NAN(DAT_0014f5d8))) goto LAB_00112034;
      }
      uVar79 = (ulong)uVar76;
      uVar73 = ((long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
      uVar76 = uVar76 + 1;
    } while (uVar79 <= uVar73 && uVar73 - uVar79 != 0);
  }
  uVar76 = (int)uVar73 - 1;
  if (uVar76 != 0) {
    uVar73 = (ulong)uVar76;
    do {
      pJVar21 = (model->mJoints).
                super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                .
                super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar76 = pJVar21[uVar73].q_index;
      if (pJVar21[uVar73].mDoFCount == 3) {
        local_588 = (ulong)(model->lambda).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar73];
        pdVar1 = (Tau->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
             pdVar1[uVar76];
        local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
             pdVar1[uVar76 + 1];
        local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
             pdVar1[uVar76 + 2];
        local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
             (double)((model->multdof3_S).
                      super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      .
                      super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar73);
        local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
             (double)((model->pA).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar73);
        local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
             (double)&local_398;
        Vector3_t::operator=
                  ((model->multdof3_u).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar73,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>_>
                    *)&local_558);
        if (local_588 != 0) {
          local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
               (double)((model->IA).
                        super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                        super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar73);
          local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
               (double)((model->multdof3_U).
                        super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        .
                        super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar73);
          local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
               (double)((model->multdof3_Dinv).
                        super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
                        super__Vector_impl_data._M_start + uVar73);
          local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
               local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [1];
          SpatialMatrix_t::
          SpatialMatrix_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,6,0,6,6>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,0>const>>
                    (&local_398,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_0>_>_>
                      *)&local_558);
          pSVar20 = (model->pA).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pSVar22 = (model->c).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pMVar23 = (model->multdof3_U).
                    super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    .
                    super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pMVar24 = (model->multdof3_Dinv).super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pVVar25 = (model->multdof3_u).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pdVar1 = (double *)
                   ((long)&pSVar20[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          pdVar2 = (double *)
                   ((long)&pSVar20[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          dVar8 = *(double *)
                   &pSVar22[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
          dVar9 = *(double *)
                   ((long)&pSVar22[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
          dVar10 = *(double *)
                    ((long)&pSVar22[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          dVar17 = *(double *)
                    ((long)&pSVar22[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
          pdVar3 = (double *)
                   ((long)&pSVar22[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          dVar39 = *pdVar3;
          dVar40 = pdVar3[1];
          dVar41 = *(double *)
                    &pSVar22[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
          dVar42 = *(double *)
                    ((long)&pSVar22[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
          dVar43 = *(double *)
                    ((long)&pSVar22[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          dVar44 = *(double *)
                    ((long)&pSVar22[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
          pdVar3 = (double *)
                   ((long)&pSVar22[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          dVar45 = *pdVar3;
          dVar46 = pdVar3[1];
          dVar47 = *(double *)
                    &pSVar22[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
          dVar48 = *(double *)
                    ((long)&pSVar22[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
          dVar49 = *(double *)
                    ((long)&pSVar22[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          dVar50 = *(double *)
                    ((long)&pSVar22[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
          pdVar3 = (double *)
                   ((long)&pSVar22[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          dVar51 = *pdVar3;
          dVar52 = pdVar3[1];
          dVar53 = *(double *)
                    &pMVar24[uVar73].super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage;
          dVar54 = *(double *)
                    ((long)&pMVar24[uVar73].super_Matrix3d.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage +
                    8);
          dVar55 = *(double *)
                    ((long)&pMVar24[uVar73].super_Matrix3d.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage +
                    0x10);
          dVar56 = *(double *)
                    &pMVar23[uVar73].super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
                     m_storage;
          dVar57 = *(double *)
                    ((long)&pMVar23[uVar73].
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                    8);
          pdVar3 = (double *)
                   ((long)&pMVar23[uVar73].
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                   0x10);
          dVar11 = *pdVar3;
          dVar12 = pdVar3[1];
          pdVar3 = (double *)
                   ((long)&pMVar23[uVar73].
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                   0x20);
          dVar13 = *pdVar3;
          dVar14 = pdVar3[1];
          pdVar3 = (double *)
                   ((long)&pMVar23[uVar73].
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                   0x30);
          dVar15 = *pdVar3;
          dVar16 = pdVar3[1];
          pdVar3 = (double *)
                   ((long)&pMVar23[uVar73].
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                   0x60);
          dVar81 = *pdVar3;
          dVar82 = pdVar3[1];
          dVar5 = dVar81 * dVar55 + dVar15 * dVar54 + dVar56 * dVar53;
          dVar6 = dVar82 * dVar55 + dVar16 * dVar54 + dVar57 * dVar53;
          auVar30._8_4_ = SUB84(dVar6,0);
          auVar30._0_8_ = dVar5;
          auVar30._12_4_ = (int)((ulong)dVar6 >> 0x20);
          pdVar3 = (double *)
                   ((long)&pMVar23[uVar73].
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                   0x40);
          dVar83 = *pdVar3;
          dVar58 = pdVar3[1];
          pdVar3 = (double *)
                   ((long)&pMVar23[uVar73].
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                   0x70);
          dVar59 = *pdVar3;
          dVar60 = pdVar3[1];
          dVar6 = dVar55 * dVar59 + dVar54 * dVar83 + dVar53 * dVar11;
          dVar7 = dVar55 * dVar60 + dVar54 * dVar58 + dVar53 * dVar12;
          auVar31._8_4_ = SUB84(dVar7,0);
          auVar31._0_8_ = dVar6;
          auVar31._12_4_ = (int)((ulong)dVar7 >> 0x20);
          pdVar3 = (double *)
                   ((long)&pMVar23[uVar73].
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                   0x50);
          dVar7 = *pdVar3;
          dVar61 = pdVar3[1];
          pdVar3 = (double *)
                   ((long)&pMVar23[uVar73].
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.m_storage +
                   0x80);
          dVar62 = *pdVar3;
          dVar63 = pdVar3[1];
          dVar64 = *(double *)
                    ((long)&pMVar24[uVar73].super_Matrix3d.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage +
                    0x18);
          dVar65 = *(double *)
                    ((long)&pMVar24[uVar73].super_Matrix3d.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage +
                    0x20);
          dVar66 = *(double *)
                    ((long)&pMVar24[uVar73].super_Matrix3d.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage +
                    0x28);
          dVar67 = *(double *)
                    ((long)&pMVar24[uVar73].super_Matrix3d.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage +
                    0x30);
          pdVar3 = (double *)
                   ((long)&pMVar24[uVar73].super_Matrix3d.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage +
                   0x38);
          dVar68 = *pdVar3;
          dVar69 = pdVar3[1];
          dVar70 = *(double *)
                    &pVVar25[uVar73].super_Vector3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage;
          pdVar3 = (double *)
                   ((long)&pVVar25[uVar73].super_Vector3d.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage +
                   8);
          dVar71 = *pdVar3;
          dVar72 = pdVar3[1];
          dStack_570 = auVar30._8_8_;
          local_3c8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
               dVar72 * (dVar81 * dVar69 + dVar15 * dVar68 + dVar56 * dVar67) +
               dVar71 * (dVar81 * dVar66 + dVar15 * dVar65 + dVar56 * dVar64) + dVar70 * dVar5 +
               dVar40 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0x1e] +
               dVar39 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0x18] +
               dVar17 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0x12] +
               dVar10 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0xc] +
               dVar9 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[6] +
               dVar8 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0] +
               *(double *)
                &pSVar20[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
          local_3c8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
               dVar72 * (dVar82 * dVar69 + dVar16 * dVar68 + dVar57 * dVar67) +
               dVar71 * (dVar82 * dVar66 + dVar16 * dVar65 + dVar57 * dVar64) + dVar70 * dStack_570
               + dVar40 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[0x1f] +
                 dVar39 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[0x19] +
                 dVar17 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[0x13] +
                 dVar10 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                          m_data.array[0xd] +
                 dVar9 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                         m_data.array[7] +
                 dVar8 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                         m_data.array[1] +
                 *(double *)
                  ((long)&pSVar20[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
          dVar5 = *(double *)
                   &pVVar25[uVar73].super_Vector3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage;
          pdVar3 = (double *)
                   ((long)&pVVar25[uVar73].super_Vector3d.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage +
                   8);
          dVar8 = *pdVar3;
          dVar9 = pdVar3[1];
          dStack_5a0 = auVar31._8_8_;
          local_3c8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
               dVar9 * (dVar59 * dVar69 + dVar83 * dVar68 + dVar11 * dVar67) +
               dVar8 * (dVar59 * dVar66 + dVar83 * dVar65 + dVar11 * dVar64) + dVar5 * dVar6 +
               dVar46 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0x20] +
               dVar45 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0x1a] +
               dVar44 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0x14] +
               dVar43 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0xe] +
               dVar42 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[8] +
               dVar41 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[2] + *pdVar1;
          local_3c8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
               dVar9 * (dVar60 * dVar69 + dVar58 * dVar68 + dVar12 * dVar67) +
               dVar8 * (dVar60 * dVar66 + dVar58 * dVar65 + dVar12 * dVar64) + dVar5 * dStack_5a0 +
               dVar46 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0x21] +
               dVar45 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0x1b] +
               dVar44 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0x15] +
               dVar43 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0xf] +
               dVar42 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[9] +
               dVar41 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[3] + pdVar1[1];
          dVar5 = *(double *)
                   &pVVar25[uVar73].super_Vector3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage;
          pdVar1 = (double *)
                   ((long)&pVVar25[uVar73].super_Vector3d.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage +
                   8);
          dVar6 = *pdVar1;
          dVar8 = pdVar1[1];
          local_3c8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
               dVar8 * (dVar69 * dVar62 + dVar68 * dVar7 + dVar67 * dVar13) +
               dVar6 * (dVar66 * dVar62 + dVar65 * dVar7 + dVar64 * dVar13) +
               dVar5 * (dVar55 * dVar62 + dVar54 * dVar7 + dVar53 * dVar13) +
               dVar52 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0x22] +
               dVar51 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0x1c] +
               dVar50 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0x16] +
               dVar49 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0x10] +
               dVar48 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[10] +
               dVar47 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[4] + *pdVar2;
          local_3c8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
               dVar8 * (dVar69 * dVar63 + dVar68 * dVar61 + dVar67 * dVar14) +
               dVar6 * (dVar66 * dVar63 + dVar65 * dVar61 + dVar64 * dVar14) +
               dVar5 * (dVar55 * dVar63 + dVar54 * dVar61 + dVar53 * dVar14) +
               dVar52 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0x23] +
               dVar51 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0x1d] +
               dVar50 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0x17] +
               dVar49 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0x11] +
               dVar48 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[0xb] +
               dVar47 * local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array[5] + pdVar2[1];
          Math::SpatialTransform::toMatrixTranspose
                    (&local_278,
                     (model->X_lambda).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar73);
          Math::SpatialTransform::toMatrix
                    (&local_158,
                     (model->X_lambda).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar73);
          dVar57 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x23];
          dVar56 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x22];
          dVar55 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x21];
          dVar54 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x20];
          dVar53 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x1f];
          dVar52 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x1e];
          dVar51 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x1d];
          dVar50 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x1c];
          dVar49 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x1b];
          dVar48 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x1a];
          dVar47 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x19];
          dVar46 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x18];
          dVar45 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x17];
          dVar44 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x16];
          dVar43 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x13];
          dVar42 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x12];
          dVar41 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x11];
          dVar40 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x10];
          dVar39 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0xd];
          dVar17 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0xc];
          dVar10 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0xb];
          dVar9 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[10];
          dVar8 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[3];
          dVar7 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[2];
          dVar6 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[1];
          dVar5 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[0];
          pSVar26 = (model->IA).
                    super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                    super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          local_3d8 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array[4];
          dStack_3d0 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[5];
          local_3e8 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array[6];
          dStack_3e0 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[7];
          local_3f8 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array[8];
          dStack_3f0 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[9];
          local_408 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array[0xe];
          dStack_400 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0xf];
          local_418 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array[0x14];
          dStack_410 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0x15];
          lVar75 = 0;
          do {
            dVar11 = *(double *)
                      ((long)local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar75);
            dVar12 = *(double *)
                      ((long)local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar75 + 8);
            dVar13 = *(double *)
                      ((long)local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar75 + 0x10);
            dVar14 = *(double *)
                      ((long)local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar75 + 0x18);
            dVar81 = dStack_3e0 * dVar12;
            dVar15 = *(double *)
                      ((long)local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar75 + 0x20);
            dVar16 = *(double *)
                      ((long)local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar75 + 0x28);
            *(double *)
             ((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array + lVar75) =
                 dVar52 * dVar16 +
                 dVar46 * dVar15 +
                 dVar42 * dVar14 + dVar17 * dVar13 + local_3e8 * dVar12 + dVar5 * dVar11;
            *(double *)
             ((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array + lVar75 + 8) =
                 dVar53 * dVar16 +
                 dVar47 * dVar15 + dVar43 * dVar14 + dVar39 * dVar13 + dVar81 + dVar6 * dVar11;
            dVar82 = dStack_3f0 * dVar12;
            dVar81 = dStack_400 * dVar13;
            dVar83 = dStack_410 * dVar14;
            *(double *)
             ((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array + lVar75 + 0x10) =
                 dVar54 * dVar16 +
                 dVar48 * dVar15 +
                 local_418 * dVar14 + local_408 * dVar13 + local_3f8 * dVar12 + dVar7 * dVar11;
            *(double *)
             ((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array + lVar75 + 0x18) =
                 dVar55 * dVar16 + dVar49 * dVar15 + dVar83 + dVar81 + dVar82 + dVar8 * dVar11;
            dVar81 = dVar11 * dStack_3d0;
            *(double *)
             ((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array + lVar75 + 0x20) =
                 dVar16 * dVar56 +
                 dVar15 * dVar50 +
                 dVar14 * dVar44 + dVar13 * dVar40 + dVar12 * dVar9 + dVar11 * local_3d8;
            *(double *)
             ((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array + lVar75 + 0x28) =
                 dVar16 * dVar57 +
                 dVar15 * dVar51 + dVar14 * dVar45 + dVar13 * dVar41 + dVar12 * dVar10 + dVar81;
            lVar75 = lVar75 + 0x30;
          } while (lVar75 != 0x120);
          lVar75 = 0;
          do {
            dVar5 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75);
            dVar6 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 8);
            dVar7 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 0x10);
            dVar8 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 0x18);
            dVar9 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 0x20);
            dVar10 = *(double *)
                      ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar75 + 0x28);
            pdVar1 = (double *)
                     ((long)&pSVar26[local_588].super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + lVar75);
            dVar17 = pdVar1[1];
            pdVar2 = (double *)
                     ((long)&pSVar26[local_588].super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + lVar75);
            *pdVar2 = dVar10 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array[0x1e] +
                      dVar9 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[0x18] +
                      dVar8 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[0x12] +
                      dVar7 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[0xc] +
                      dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[6] +
                      dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[0] + *pdVar1;
            pdVar2[1] = dVar10 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x1f] +
                        dVar9 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[0x19] +
                        dVar8 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[0x13] +
                        dVar7 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[0xd] +
                        dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[7] +
                        dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[1] + dVar17;
            dVar5 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75);
            dVar6 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 8);
            dVar7 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 0x10);
            dVar8 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 0x18);
            dVar9 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 0x20);
            dVar10 = *(double *)
                      ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar75 + 0x28);
            pdVar1 = (double *)
                     ((long)&pSVar26[local_588].super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                     lVar75 + 0x10);
            dVar17 = pdVar1[1];
            pdVar2 = (double *)
                     ((long)&pSVar26[local_588].super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                     lVar75 + 0x10);
            *pdVar2 = dVar10 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array[0x20] +
                      dVar9 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[0x1a] +
                      dVar8 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[0x14] +
                      dVar7 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[0xe] +
                      dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[8] +
                      dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[2] + *pdVar1;
            pdVar2[1] = dVar10 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x21] +
                        dVar9 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[0x1b] +
                        dVar8 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[0x15] +
                        dVar7 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[0xf] +
                        dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[9] +
                        dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[3] + dVar17;
            dVar5 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75);
            dVar6 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 8);
            dVar7 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 0x10);
            dVar8 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 0x18);
            dVar9 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 0x20);
            dVar10 = *(double *)
                      ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar75 + 0x28);
            pdVar1 = (double *)
                     ((long)&pSVar26[local_588].super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                     lVar75 + 0x20);
            dVar17 = pdVar1[1];
            pdVar2 = (double *)
                     ((long)&pSVar26[local_588].super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                     lVar75 + 0x20);
            *pdVar2 = dVar10 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array[0x22] +
                      dVar9 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[0x1c] +
                      dVar8 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[0x16] +
                      dVar7 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[0x10] +
                      dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[10] +
                      dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[4] + *pdVar1;
            pdVar2[1] = dVar10 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x23] +
                        dVar9 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[0x1d] +
                        dVar8 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[0x17] +
                        dVar7 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[0x11] +
                        dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[0xb] +
                        dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[5] + dVar17;
            lVar75 = lVar75 + 0x30;
          } while (lVar75 != 0x120);
LAB_0011339c:
          Math::SpatialTransform::applyTranspose
                    ((model->X_lambda).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar73,&local_3c8);
          pSVar20 = (model->pA).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          dVar5 = local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[1] +
                  *(double *)
                   ((long)&pSVar20[local_588].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
          auVar32._8_4_ = SUB84(dVar5,0);
          auVar32._0_8_ =
               local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [0] + *(double *)
                      &pSVar20[local_588].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
          auVar32._12_4_ = (int)((ulong)dVar5 >> 0x20);
          *(undefined1 (*) [16])
           &pSVar20[local_588].super_Matrix<double,_6,_1,_0,_6,_1>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = auVar32;
          pdVar1 = (double *)
                   ((long)&pSVar20[local_588].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
          dVar5 = local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[3] + pdVar1[1];
          auVar33._8_4_ = SUB84(dVar5,0);
          auVar33._0_8_ =
               local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [2] + *pdVar1;
          auVar33._12_4_ = (int)((ulong)dVar5 >> 0x20);
          *(undefined1 (*) [16])
           ((long)&pSVar20[local_588].super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = auVar33;
          pdVar1 = (double *)
                   ((long)&pSVar20[local_588].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
          dVar5 = local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[5] + pdVar1[1];
          auVar34._8_4_ = SUB84(dVar5,0);
          auVar34._0_8_ =
               local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [4] + *pdVar1;
          auVar34._12_4_ = (int)((ulong)dVar5 >> 0x20);
          *(undefined1 (*) [16])
           ((long)&pSVar20[local_588].super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = auVar34;
        }
      }
      else {
        pSVar20 = (model->S).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pSVar22 = (model->pA).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar1 = (double *)
                 ((long)&pSVar20[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        pdVar2 = (double *)
                 ((long)&pSVar22[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        pdVar3 = (double *)
                 ((long)&pSVar20[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        pdVar4 = (double *)
                 ((long)&pSVar22[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        (model->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
        [uVar73] = (Tau->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data[uVar76] -
                   (pdVar3[1] * pdVar4[1] + pdVar1[1] * pdVar2[1] +
                    *(double *)
                     ((long)&pSVar20[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) *
                    *(double *)
                     ((long)&pSVar22[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) +
                   *pdVar3 * *pdVar4 + *pdVar1 * *pdVar2 +
                   *(double *)
                    &pSVar20[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *
                   *(double *)
                    &pSVar22[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>);
        local_588 = (ulong)(model->lambda).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar73];
        if (local_588 != 0) {
          local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
               (double)((model->IA).
                        super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                        super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar73);
          local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
               (double)((model->U).
                        super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                        super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar73);
          local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
               (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data[uVar73];
          local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
               local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
               [1];
          SpatialMatrix_t::
          SpatialMatrix_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,6,0,6,6>const,Eigen::Product<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const>,0>const>>
                    (&local_398,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_const_Eigen::Product<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>,_0>_>_>
                      *)&local_558);
          local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
               (double)((model->pA).
                        super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                        super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar73);
          local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
               (double)((model->c).
                        super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                        super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar73);
          local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
               (double)((model->U).
                        super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                        super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar73);
          local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[8] =
               (model->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data[uVar73];
          local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xb] =
               (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data[uVar73];
          local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
               (double)&local_398;
          SpatialVector_t::
          SpatialVector_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const>>
                    (&local_3c8,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>_>
                      *)&local_558);
          Math::SpatialTransform::toMatrixTranspose
                    (&local_278,
                     (model->X_lambda).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar73);
          Math::SpatialTransform::toMatrix
                    (&local_158,
                     (model->X_lambda).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar73);
          dVar57 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x23];
          dVar56 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x22];
          dVar55 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x21];
          dVar54 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x20];
          dVar53 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x1f];
          dVar52 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x1e];
          dVar51 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x1d];
          dVar50 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x1c];
          dVar49 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x1b];
          dVar48 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x1a];
          dVar47 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x19];
          dVar46 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x18];
          dVar45 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x17];
          dVar44 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x16];
          dVar43 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x13];
          dVar42 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x12];
          dVar41 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x11];
          dVar40 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0x10];
          dVar39 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0xd];
          dVar17 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0xc];
          dVar10 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0xb];
          dVar9 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[10];
          dVar8 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[3];
          dVar7 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[2];
          dVar6 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[1];
          dVar5 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                  array[0];
          pSVar26 = (model->IA).
                    super_vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                    super__Vector_base<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          local_3d8 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array[4];
          dStack_3d0 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[5];
          local_3e8 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array[6];
          dStack_3e0 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[7];
          local_3f8 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array[8];
          dStack_3f0 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[9];
          local_408 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array[0xe];
          dStack_400 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0xf];
          local_418 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                      array[0x14];
          dStack_410 = local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data
                       .array[0x15];
          lVar75 = 0;
          do {
            dVar11 = *(double *)
                      ((long)local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar75);
            dVar12 = *(double *)
                      ((long)local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar75 + 8);
            dVar13 = *(double *)
                      ((long)local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar75 + 0x10);
            dVar14 = *(double *)
                      ((long)local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar75 + 0x18);
            dVar81 = dStack_3e0 * dVar12;
            dVar15 = *(double *)
                      ((long)local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar75 + 0x20);
            dVar16 = *(double *)
                      ((long)local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar75 + 0x28);
            *(double *)
             ((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array + lVar75) =
                 dVar52 * dVar16 +
                 dVar46 * dVar15 +
                 dVar42 * dVar14 + dVar17 * dVar13 + local_3e8 * dVar12 + dVar5 * dVar11;
            *(double *)
             ((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array + lVar75 + 8) =
                 dVar53 * dVar16 +
                 dVar47 * dVar15 + dVar43 * dVar14 + dVar39 * dVar13 + dVar81 + dVar6 * dVar11;
            dVar82 = dStack_3f0 * dVar12;
            dVar81 = dStack_400 * dVar13;
            dVar83 = dStack_410 * dVar14;
            *(double *)
             ((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array + lVar75 + 0x10) =
                 dVar54 * dVar16 +
                 dVar48 * dVar15 +
                 local_418 * dVar14 + local_408 * dVar13 + local_3f8 * dVar12 + dVar7 * dVar11;
            *(double *)
             ((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array + lVar75 + 0x18) =
                 dVar55 * dVar16 + dVar49 * dVar15 + dVar83 + dVar81 + dVar82 + dVar8 * dVar11;
            dVar81 = dVar11 * dStack_3d0;
            *(double *)
             ((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array + lVar75 + 0x20) =
                 dVar16 * dVar56 +
                 dVar15 * dVar50 +
                 dVar14 * dVar44 + dVar13 * dVar40 + dVar12 * dVar9 + dVar11 * local_3d8;
            *(double *)
             ((long)local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array + lVar75 + 0x28) =
                 dVar16 * dVar57 +
                 dVar15 * dVar51 + dVar14 * dVar45 + dVar13 * dVar41 + dVar12 * dVar10 + dVar81;
            lVar75 = lVar75 + 0x30;
          } while (lVar75 != 0x120);
          lVar75 = 0;
          do {
            dVar5 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75);
            dVar6 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 8);
            dVar7 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 0x10);
            dVar8 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 0x18);
            dVar9 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 0x20);
            dVar10 = *(double *)
                      ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar75 + 0x28);
            pdVar1 = (double *)
                     ((long)&pSVar26[local_588].super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + lVar75);
            dVar17 = pdVar1[1];
            pdVar2 = (double *)
                     ((long)&pSVar26[local_588].super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> + lVar75);
            *pdVar2 = dVar10 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array[0x1e] +
                      dVar9 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[0x18] +
                      dVar8 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[0x12] +
                      dVar7 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[0xc] +
                      dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[6] +
                      dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[0] + *pdVar1;
            pdVar2[1] = dVar10 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x1f] +
                        dVar9 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[0x19] +
                        dVar8 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[0x13] +
                        dVar7 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[0xd] +
                        dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[7] +
                        dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[1] + dVar17;
            dVar5 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75);
            dVar6 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 8);
            dVar7 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 0x10);
            dVar8 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 0x18);
            dVar9 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 0x20);
            dVar10 = *(double *)
                      ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar75 + 0x28);
            pdVar1 = (double *)
                     ((long)&pSVar26[local_588].super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                     lVar75 + 0x10);
            dVar17 = pdVar1[1];
            pdVar2 = (double *)
                     ((long)&pSVar26[local_588].super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                     lVar75 + 0x10);
            *pdVar2 = dVar10 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array[0x20] +
                      dVar9 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[0x1a] +
                      dVar8 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[0x14] +
                      dVar7 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[0xe] +
                      dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[8] +
                      dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[2] + *pdVar1;
            pdVar2[1] = dVar10 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x21] +
                        dVar9 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[0x1b] +
                        dVar8 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[0x15] +
                        dVar7 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[0xf] +
                        dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[9] +
                        dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[3] + dVar17;
            dVar5 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75);
            dVar6 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 8);
            dVar7 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 0x10);
            dVar8 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 0x18);
            dVar9 = *(double *)
                     ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                            m_data.array + lVar75 + 0x20);
            dVar10 = *(double *)
                      ((long)local_158.super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                             m_data.array + lVar75 + 0x28);
            pdVar1 = (double *)
                     ((long)&pSVar26[local_588].super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                     lVar75 + 0x20);
            dVar17 = pdVar1[1];
            pdVar2 = (double *)
                     ((long)&pSVar26[local_588].super_Matrix<double,_6,_6,_0,_6,_6>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> +
                     lVar75 + 0x20);
            *pdVar2 = dVar10 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                               m_storage.m_data.array[0x22] +
                      dVar9 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[0x1c] +
                      dVar8 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[0x16] +
                      dVar7 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[0x10] +
                      dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[10] +
                      dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                              .m_data.array[4] + *pdVar1;
            pdVar2[1] = dVar10 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                 m_storage.m_data.array[0x23] +
                        dVar9 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[0x1d] +
                        dVar8 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[0x17] +
                        dVar7 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[0x11] +
                        dVar6 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[0xb] +
                        dVar5 * local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                                m_storage.m_data.array[5] + dVar17;
            lVar75 = lVar75 + 0x30;
          } while (lVar75 != 0x120);
          goto LAB_0011339c;
        }
      }
      uVar73 = uVar73 - 1;
    } while ((int)uVar73 != 0);
  }
  dVar5 = (model->gravity).super_Vector3d.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  pSVar20 = (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
            super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
            super__Vector_impl_data._M_start;
  dVar6 = (model->gravity).super_Vector3d.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  dVar7 = (model->gravity).super_Vector3d.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  *(undefined8 *)
   &(pSVar20->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
  *(double *)
   ((long)&(pSVar20->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
  *(double *)
   ((long)&(pSVar20->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = 0.0;
  *(double *)
   ((long)&(pSVar20->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18) = -dVar6;
  *(double *)
   ((long)&(pSVar20->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = -dVar7;
  *(double *)
   ((long)&(pSVar20->super_Matrix<double,_6,_1,_0,_6,_1>).
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) = -dVar5;
  if (1 < (ulong)(((long)(model->mBodies).
                         super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         .
                         super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(model->mBodies).
                         super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         .
                         super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7)) {
    uVar73 = 1;
    uVar76 = 2;
    do {
      uVar18 = (model->mJoints).
               super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               .
               super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar73].q_index;
      uVar19 = (model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar73];
      pSVar27 = (model->X_lambda).
                super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                .
                super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar77 = pSVar27 + uVar73;
      pSVar78 = (SpatialTransform *)&local_558;
      for (lVar75 = 9; lVar75 != 0; lVar75 = lVar75 + -1) {
        (pSVar78->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[0] = *(double *)&(pSVar77->E).super_Matrix3d;
        pSVar77 = (pointer)((long)pSVar77 + ((ulong)bVar80 * -2 + 1) * 8);
        pSVar78 = (SpatialTransform *)((long)pSVar78 + (ulong)bVar80 * -0x10 + 8);
      }
      local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xb] =
           *(double *)((long)&pSVar27[uVar73].r.super_Vector3d + 0x10);
      local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[9] =
           *(double *)
            &pSVar27[uVar73].r.super_Vector3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
      local_558.super_Matrix<double,_6,_6,_0,_6,_6>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[10] =
           *(double *)
            ((long)&pSVar27[uVar73].r.super_Vector3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> + 8);
      Math::SpatialTransform::apply
                ((SpatialTransform *)&local_558,
                 (model->a).
                 super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar19);
      pSVar20 = (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pSVar22 = (model->c).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                .super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      dVar5 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1]
              + *(double *)
                 ((long)&pSVar22[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
      auVar35._8_4_ = SUB84(dVar5,0);
      auVar35._0_8_ =
           local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] +
           *(double *)
            &pSVar22[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
      auVar35._12_4_ = (int)((ulong)dVar5 >> 0x20);
      *(undefined1 (*) [16])
       &pSVar20[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = auVar35;
      pdVar1 = (double *)
               ((long)&pSVar22[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
      dVar5 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3]
              + pdVar1[1];
      auVar36._8_4_ = SUB84(dVar5,0);
      auVar36._0_8_ =
           local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] +
           *pdVar1;
      auVar36._12_4_ = (int)((ulong)dVar5 >> 0x20);
      *(undefined1 (*) [16])
       ((long)&pSVar20[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10) = auVar36;
      pdVar1 = (double *)
               ((long)&pSVar22[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
      dVar5 = local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
              super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5]
              + pdVar1[1];
      auVar37._8_4_ = SUB84(dVar5,0);
      auVar37._0_8_ =
           local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] +
           *pdVar1;
      auVar37._12_4_ = (int)((ulong)dVar5 >> 0x20);
      *(undefined1 (*) [16])
       ((long)&pSVar20[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = auVar37;
      if ((model->mJoints).
          super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          .
          super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar73].mDoFCount == 3) {
        local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
             (double)((model->multdof3_Dinv).
                      super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar73);
        local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
             (double)((model->multdof3_u).super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>.
                      _M_impl.super__Vector_impl_data._M_start + uVar73);
        local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
             (double)((model->multdof3_U).
                      super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      .
                      super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar73);
        local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
             (double)((model->a).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar73);
        Vector3_t::
        Vector3_t<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>,0>>
                  ((Vector3_t *)&local_278,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_0>_>
                    *)&local_398);
        pdVar1 = (QDDot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        pdVar1[uVar18] =
             local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0];
        pdVar1[uVar18 + 1] =
             local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1];
        pdVar1[uVar18 + 2] =
             local_278.super_Matrix<double,_6,_6,_0,_6,_6>.
             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2];
        local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
             (double)((model->a).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar73);
        local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
             (double)((model->multdof3_S).
                      super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      .
                      super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar73);
        local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
             (double)&local_278;
        SpatialVector_t::operator=
                  ((SpatialVector_t *)
                   local_398.super_Matrix<double,_6,_6,_0,_6,_6>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                   array[0],(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                             *)&local_398);
      }
      else {
        pSVar20 = (model->a).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pSVar22 = (model->U).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar1 = (double *)
                 ((long)&pSVar22[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        pdVar2 = (double *)
                 ((long)&pSVar20[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        pdVar3 = (double *)
                 ((long)&pSVar22[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        pdVar4 = (double *)
                 ((long)&pSVar20[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar6 = ((model->u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                 .m_data[uVar73] -
                (pdVar3[1] * pdVar4[1] + pdVar1[1] * pdVar2[1] +
                 *(double *)
                  ((long)&pSVar22[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) *
                 *(double *)
                  ((long)&pSVar20[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) +
                *pdVar3 * *pdVar4 + *pdVar1 * *pdVar2 +
                *(double *)
                 &pSVar22[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *
                *(double *)
                 &pSVar20[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>)) *
                (1.0 / (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data[uVar73]);
        (QDDot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
        [uVar18] = dVar6;
        pSVar22 = (model->S).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        dVar7 = *(double *)
                 ((long)&pSVar22[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
        dVar5 = *(double *)
                 ((long)&pSVar20[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
        *(double *)
         &pSVar20[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> =
             *(double *)
              &pSVar22[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> * dVar6 +
             *(double *)
              &pSVar20[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
        *(double *)
         ((long)&pSVar20[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) =
             dVar7 * dVar6 + dVar5;
        pdVar1 = (double *)
                 ((long)&pSVar22[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar7 = pdVar1[1];
        pdVar2 = (double *)
                 ((long)&pSVar20[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar5 = pdVar2[1];
        pdVar3 = (double *)
                 ((long)&pSVar20[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        *pdVar3 = *pdVar1 * dVar6 + *pdVar2;
        pdVar3[1] = dVar7 * dVar6 + dVar5;
        pdVar1 = (double *)
                 ((long)&pSVar22[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        pdVar2 = (double *)
                 ((long)&pSVar20[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar5 = dVar6 * pdVar1[1] + pdVar2[1];
        auVar38._8_4_ = SUB84(dVar5,0);
        auVar38._0_8_ = dVar6 * *pdVar1 + *pdVar2;
        auVar38._12_4_ = (int)((ulong)dVar5 >> 0x20);
        *(undefined1 (*) [16])
         ((long)&pSVar20[uVar73].super_Matrix<double,_6,_1,_0,_6,_1>.
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) = auVar38;
      }
      uVar73 = (ulong)uVar76;
      uVar79 = ((long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
      uVar76 = uVar76 + 1;
    } while (uVar73 <= uVar79 && uVar79 - uVar73 != 0);
  }
  return;
}

Assistant:

RBDL_DLLAPI
void ForwardDynamicsApplyConstraintForces (
		Model &model,
		const VectorNd &Tau,
		ConstraintSet &CS,
		VectorNd &QDDot
		) {
	LOG << "-------- " << __func__ << " --------" << std::endl;
	assert (QDDot.size() == model.dof_count);

	unsigned int i = 0;

	for (i = 1; i < model.mBodies.size(); i++) {
		model.IA[i] = model.I[i].toMatrix();;
		model.pA[i] = crossf(model.v[i],model.I[i] * model.v[i]);

		if (CS.f_ext_constraints[i] != SpatialVectorZero) {
			LOG << "External force (" << i << ") = " << model.X_base[i].toMatrixAdjoint() * CS.f_ext_constraints[i] << std::endl;
			model.pA[i] -= model.X_base[i].toMatrixAdjoint() * CS.f_ext_constraints[i];
		}
	}

// ClearLogOutput();

	LOG << "--- first loop ---" << std::endl;

	for (i = model.mBodies.size() - 1; i > 0; i--) {
		unsigned int q_index = model.mJoints[i].q_index;

		if (model.mJoints[i].mDoFCount == 3) {
			unsigned int lambda = model.lambda[i];

			model.multdof3_u[i] = Vector3d (Tau[q_index], Tau[q_index + 1], Tau[q_index + 2]) - model.multdof3_S[i].transpose() * model.pA[i];

			if (lambda != 0) {
				SpatialMatrix Ia = model.IA[i] - model.multdof3_U[i] * model.multdof3_Dinv[i] * model.multdof3_U[i].transpose();
				SpatialVector pa = model.pA[i] + Ia * model.c[i] + model.multdof3_U[i] * model.multdof3_Dinv[i] * model.multdof3_u[i];
#ifdef EIGEN_CORE_H
				model.IA[lambda].noalias() += model.X_lambda[i].toMatrixTranspose() * Ia * model.X_lambda[i].toMatrix();
				model.pA[lambda].noalias() += model.X_lambda[i].applyTranspose(pa);
#else
				model.IA[lambda] += model.X_lambda[i].toMatrixTranspose() * Ia * model.X_lambda[i].toMatrix();
				model.pA[lambda] += model.X_lambda[i].applyTranspose(pa);
#endif
				LOG << "pA[" << lambda << "] = " << model.pA[lambda].transpose() << std::endl;
			}
		} else {
			model.u[i] = Tau[q_index] - model.S[i].dot(model.pA[i]);

			unsigned int lambda = model.lambda[i];
			if (lambda != 0) {
				SpatialMatrix Ia = model.IA[i] - model.U[i] * (model.U[i] / model.d[i]).transpose();
				SpatialVector pa = model.pA[i] + Ia * model.c[i] + model.U[i] * model.u[i] / model.d[i];
#ifdef EIGEN_CORE_H
				model.IA[lambda].noalias() += model.X_lambda[i].toMatrixTranspose() * Ia * model.X_lambda[i].toMatrix();
				model.pA[lambda].noalias() += model.X_lambda[i].applyTranspose(pa);
#else
				model.IA[lambda] += model.X_lambda[i].toMatrixTranspose() * Ia * model.X_lambda[i].toMatrix();
				model.pA[lambda] += model.X_lambda[i].applyTranspose(pa);
#endif
				LOG << "pA[" << lambda << "] = " << model.pA[lambda].transpose() << std::endl;
			}
		}
	}
	
	model.a[0] = SpatialVector (0., 0., 0., -model.gravity[0], -model.gravity[1], -model.gravity[2]);

	for (i = 1; i < model.mBodies.size(); i++) {
		unsigned int q_index = model.mJoints[i].q_index;
		unsigned int lambda = model.lambda[i];
		SpatialTransform X_lambda = model.X_lambda[i];

		model.a[i] = X_lambda.apply(model.a[lambda]) + model.c[i];
		LOG << "a'[" << i << "] = " << model.a[i].transpose() << std::endl;

		if (model.mJoints[i].mDoFCount == 3) {
			Vector3d qdd_temp = model.multdof3_Dinv[i] * (model.multdof3_u[i] - model.multdof3_U[i].transpose() * model.a[i]);
			QDDot[q_index] = qdd_temp[0];
			QDDot[q_index + 1] = qdd_temp[1];
			QDDot[q_index + 2] = qdd_temp[2];
			model.a[i] = model.a[i] + model.multdof3_S[i] * qdd_temp;
		} else {
			QDDot[q_index] = (1./model.d[i]) * (model.u[i] - model.U[i].dot(model.a[i]));
			model.a[i] = model.a[i] + model.S[i] * QDDot[q_index];
		}
	}

	LOG << "QDDot = " << QDDot.transpose() << std::endl;
}